

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::tracker_error_alert>
               (char *dst,char *src)

{
  int *piVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  
  *(undefined8 *)(dst + 8) = *(undefined8 *)(src + 8);
  *(undefined ***)dst = &PTR__torrent_alert_004dc350;
  uVar10 = *(undefined8 *)(src + 0x18);
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(src + 0x10);
  *(undefined8 *)(dst + 0x18) = uVar10;
  src[0x10] = '\0';
  src[0x11] = '\0';
  src[0x12] = '\0';
  src[0x13] = '\0';
  src[0x14] = '\0';
  src[0x15] = '\0';
  src[0x16] = '\0';
  src[0x17] = '\0';
  src[0x18] = '\0';
  src[0x19] = '\0';
  src[0x1a] = '\0';
  src[0x1b] = '\0';
  src[0x1c] = '\0';
  src[0x1d] = '\0';
  src[0x1e] = '\0';
  src[0x1f] = '\0';
  *(undefined4 *)(dst + 0x28) = *(undefined4 *)(src + 0x28);
  *(undefined8 *)(dst + 0x20) = *(undefined8 *)(src + 0x20);
  *(undefined ***)dst = &PTR__torrent_alert_004dc3d0;
  uVar10 = *(undefined8 *)(src + 0x34);
  uVar11 = *(undefined8 *)(src + 0x38);
  uVar12 = *(undefined8 *)(src + 0x40);
  *(undefined8 *)(dst + 0x2c) = *(undefined8 *)(src + 0x2c);
  *(undefined8 *)(dst + 0x34) = uVar10;
  *(undefined8 *)(dst + 0x38) = uVar11;
  *(undefined8 *)(dst + 0x40) = uVar12;
  *(undefined4 *)(dst + 0x48) = *(undefined4 *)(src + 0x48);
  dst[0x4c] = src[0x4c];
  *(undefined ***)dst = &PTR__torrent_alert_004dc5e8;
  uVar3 = *(undefined4 *)(src + 0x54);
  uVar4 = *(undefined4 *)(src + 0x58);
  uVar5 = *(undefined4 *)(src + 0x5c);
  uVar6 = *(undefined4 *)(src + 0x60);
  uVar7 = *(undefined4 *)(src + 100);
  uVar8 = *(undefined4 *)(src + 0x68);
  uVar9 = *(undefined4 *)(src + 0x6c);
  *(undefined4 *)(dst + 0x50) = *(undefined4 *)(src + 0x50);
  *(undefined4 *)(dst + 0x54) = uVar3;
  *(undefined4 *)(dst + 0x58) = uVar4;
  *(undefined4 *)(dst + 0x5c) = uVar5;
  *(undefined4 *)(dst + 0x60) = uVar6;
  *(undefined4 *)(dst + 100) = uVar7;
  *(undefined4 *)(dst + 0x68) = uVar8;
  *(undefined4 *)(dst + 0x6c) = uVar9;
  *(undefined ***)src = &PTR__torrent_alert_004dc350;
  plVar2 = *(long **)(src + 0x18);
  if (plVar2 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar2 + 0xc);
      iVar13 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar13 = *(int *)((long)plVar2 + 0xc);
      *(int *)((long)plVar2 + 0xc) = iVar13 + -1;
    }
    if (iVar13 == 1) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}